

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Mat6x6d * __thiscall OpenMD::HydroProp::getDiffusionTensor(HydroProp *this,RealType temperature)

{
  RectMatrix<double,_6U,_6U> *in_RDI;
  RealType kt;
  Mat6x6d XiCopy;
  Mat6x6d *D;
  RectMatrix<double,_6U,_6U> *this_00;
  SquareMatrix<double,_6> *in_stack_ffffffffffffff90;
  SquareMatrix<double,_6> *in_stack_ffffffffffffff98;
  
  this_00 = in_RDI;
  SquareMatrix<double,_6>::SquareMatrix
            ((SquareMatrix<double,_6> *)in_RDI,(SquareMatrix<double,_6> *)in_RDI);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)this_00);
  invertMatrix<OpenMD::SquareMatrix<double,6>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RectMatrix<double,_6U,_6U>::operator*=(this_00,(double)in_RDI);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x36cd9d);
  return (Mat6x6d *)in_RDI;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensor(RealType temperature) {
    Mat6x6d XiCopy = Xi_;
    Mat6x6d D;
    invertMatrix(XiCopy, D);
    RealType kt = Constants::kb * temperature;  // in kcal mol^-1
    D *= kt;  // now in angstroms^2 fs^-1  (at least for Trans-trans)
    return D;
  }